

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O1

FT_Error tt_face_load_cmap(TT_Face face,FT_Stream stream)

{
  FT_Error FVar1;
  
  FVar1 = (*face->goto_table)(face,0x636d6170,stream,&face->cmap_size);
  if (FVar1 == 0) {
    FVar1 = FT_Stream_ExtractFrame(stream,face->cmap_size,&face->cmap_table);
    if (FVar1 == 0) {
      FVar1 = 0;
    }
    else {
      face->cmap_size = 0;
    }
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cmap( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;


    error = face->goto_table( face, TTAG_cmap, stream, &face->cmap_size );
    if ( error )
      goto Exit;

    if ( FT_FRAME_EXTRACT( face->cmap_size, face->cmap_table ) )
      face->cmap_size = 0;

  Exit:
    return error;
  }